

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAuto.c
# Opt level: O0

void Abc_NtkAutoPrintAll(DdManager *dd,int nInputs,DdNode **pbOutputs,int nOutputs,
                        char **pInputNames,char **pOutputNames,int fNaive)

{
  uint nvars;
  uint uVar1;
  abctime aVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *n_02;
  DdNode *n_03;
  abctime aVar3;
  double Num;
  abctime clk;
  uint local_88;
  int nSuppSizeMax;
  int nAutoSymOuts;
  int nAutoSymsMaxSupp;
  int nAutoSymsMax;
  int nAutoSyms;
  int nAutos;
  int o;
  int SigCounter;
  int nSupp;
  double nMints;
  DdNode *zEquations;
  DdNode *bReduced;
  DdNode *bCanVars;
  DdNode *bSpace2;
  DdNode *bSpace1;
  char **pOutputNames_local;
  char **pInputNames_local;
  int nOutputs_local;
  DdNode **pbOutputs_local;
  int nInputs_local;
  DdManager *dd_local;
  
  local_88 = 0;
  nAutoSymsMaxSupp = 0;
  nAutoSymOuts = 0;
  nSuppSizeMax = 0;
  clk._4_4_ = 0;
  aVar2 = Abc_Clock();
  for (nAutoSyms = 0; nAutoSyms < nOutputs; nAutoSyms = nAutoSyms + 1) {
    n = Extra_bddSpaceFromFunction(dd,pbOutputs[nAutoSyms],pbOutputs[nAutoSyms]);
    Cudd_Ref(n);
    n_00 = Extra_bddSpaceCanonVars(dd,n);
    Cudd_Ref(n_00);
    n_01 = Extra_bddSpaceReduce(dd,pbOutputs[nAutoSyms],n_00);
    Cudd_Ref(n_01);
    n_02 = Extra_bddSpaceEquations(dd,n);
    Cudd_Ref(n_02);
    nvars = Cudd_SupportSize(dd,n);
    Num = Cudd_CountMinterm(dd,n,nvars);
    uVar1 = Extra_Base2LogDouble(Num);
    printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",(ulong)(uint)nAutoSyms,(ulong)nvars,
           (ulong)uVar1);
    if (0 < (int)uVar1) {
      local_88 = local_88 + 1;
      nAutoSymsMaxSupp = uVar1 + nAutoSymsMaxSupp;
      if (nAutoSymOuts < (int)uVar1) {
        nSuppSizeMax = nvars;
        nAutoSymOuts = uVar1;
      }
    }
    if ((int)clk._4_4_ < (int)nvars) {
      clk._4_4_ = nvars;
    }
    n_03 = Extra_bddSpaceFromMatrixPos(dd,n_02);
    Cudd_Ref(n_03);
    if (n != n_03) {
      printf("Spaces are NOT EQUAL!\n");
    }
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_03);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,n_01);
    Cudd_RecursiveDerefZdd(dd,n_02);
  }
  printf("The cumulative statistics for all outputs:\n");
  printf("Ins=%3d ",(ulong)(uint)nInputs);
  printf("InMax=%3d   ",(ulong)clk._4_4_);
  printf("Outs=%3d ",(ulong)(uint)nOutputs);
  printf("Auto=%3d   ",(ulong)local_88);
  printf("SumK=%3d ",(ulong)(uint)nAutoSymsMaxSupp);
  printf("KMax=%2d ",(ulong)(uint)nAutoSymOuts);
  printf("Supp=%3d   ",(ulong)(uint)nSuppSizeMax);
  aVar3 = Abc_Clock();
  printf("Time=%4.2f ",(double)((float)(aVar3 - aVar2) / 1e+06));
  printf("\n");
  return;
}

Assistant:

void Abc_NtkAutoPrintAll( DdManager * dd, int nInputs, DdNode * pbOutputs[], int nOutputs, char * pInputNames[], char * pOutputNames[], int fNaive )
{
	DdNode * bSpace1, * bSpace2, * bCanVars, * bReduced, * zEquations;
	double nMints; 
	int nSupp, SigCounter, o;

	int nAutos;
	int nAutoSyms;
	int nAutoSymsMax;
	int nAutoSymsMaxSupp;
	int nAutoSymOuts;
	int nSuppSizeMax;
	abctime clk;
	
	nAutoSymOuts = 0;
	nAutoSyms    = 0;
	nAutoSymsMax = 0;
	nAutoSymsMaxSupp = 0;
	nSuppSizeMax = 0;
	clk = Abc_Clock();

	SigCounter = 0;
	for ( o = 0; o < nOutputs; o++ )
	{
//		bSpace1  = Extra_bddSpaceFromFunctionFast( dd, pbOutputs[o] );           Cudd_Ref( bSpace1 );
		bSpace1  = Extra_bddSpaceFromFunction( dd, pbOutputs[o], pbOutputs[o] ); Cudd_Ref( bSpace1 );
		bCanVars = Extra_bddSpaceCanonVars( dd, bSpace1 );                       Cudd_Ref( bCanVars );
		bReduced = Extra_bddSpaceReduce( dd, pbOutputs[o], bCanVars );           Cudd_Ref( bReduced );
		zEquations = Extra_bddSpaceEquations( dd, bSpace1 );                     Cudd_Ref( zEquations );

		nSupp  = Cudd_SupportSize( dd, bSpace1 );
		nMints = Cudd_CountMinterm( dd, bSpace1, nSupp );
		nAutos = Extra_Base2LogDouble(nMints);
		printf( "Output #%3d: Inputs = %2d. AutoK = %2d.\n", o, nSupp, nAutos );

		if ( nAutos > 0 )
		{
			nAutoSymOuts++;
			nAutoSyms += nAutos;
			if ( nAutoSymsMax < nAutos )
			{
				nAutoSymsMax = nAutos;
				nAutoSymsMaxSupp = nSupp;
			}
		}
		if ( nSuppSizeMax < nSupp )
			nSuppSizeMax = nSupp;


//ABC_PRB( dd, bCanVars );
//ABC_PRB( dd, bReduced );
//Cudd_PrintMinterm( dd, bReduced );
//printf( "The equations are:\n" );
//Cudd_zddPrintCover( dd, zEquations );
//printf( "\n" );
//fflush( stdout );

		bSpace2 = Extra_bddSpaceFromMatrixPos( dd, zEquations );   Cudd_Ref( bSpace2 );
//ABC_PRB( dd, bSpace1 );
//ABC_PRB( dd, bSpace2 );
		if ( bSpace1 != bSpace2 )
			printf( "Spaces are NOT EQUAL!\n" );
//		else
//			printf( "Spaces are equal.\n" );
	
		Cudd_RecursiveDeref( dd, bSpace1 );
		Cudd_RecursiveDeref( dd, bSpace2 );
		Cudd_RecursiveDeref( dd, bCanVars );
		Cudd_RecursiveDeref( dd, bReduced );
		Cudd_RecursiveDerefZdd( dd, zEquations );
	}

	printf( "The cumulative statistics for all outputs:\n" );
	printf( "Ins=%3d ",      nInputs );
	printf( "InMax=%3d   ",  nSuppSizeMax );
	printf( "Outs=%3d ",     nOutputs );
	printf( "Auto=%3d   ",   nAutoSymOuts );
	printf( "SumK=%3d ",     nAutoSyms );
	printf( "KMax=%2d ",     nAutoSymsMax );
	printf( "Supp=%3d   ",   nAutoSymsMaxSupp );
	printf( "Time=%4.2f ", (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC) );
	printf( "\n" );
}